

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::UninterpretedOption_NamePart::_InternalParse
          (UninterpretedOption_NamePart *this,char *ptr,ParseContext *ctx)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte bVar2;
  uint uVar3;
  char cVar4;
  uint tag;
  uint32 uVar5;
  Arena *arena;
  uint uVar6;
  pair<const_char_*,_unsigned_int> pVar7;
  pair<const_char_*,_unsigned_long> pVar8;
  pair<const_char_*,_bool> pVar9;
  
  this_00 = &this->name_part_;
  uVar6 = 0;
  do {
    if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
      pVar9._8_8_ = 0;
      pVar9.first = ptr;
    }
    else {
      pVar9._8_8_ = 1;
      pVar9.first = ptr;
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        pVar9 = internal::EpsCopyInputStream::DoneFallback
                          (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      }
    }
    ptr = pVar9.first;
    if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_0034caf1;
    bVar1 = *ptr;
    pVar7.second._0_1_ = bVar1;
    pVar7.first = (char *)((byte *)ptr + 1);
    pVar7._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      uVar5 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar7 = internal::ReadTagFallback(ptr,uVar5);
      }
      else {
        pVar7.second = uVar5;
        pVar7.first = (char *)((byte *)ptr + 2);
        pVar7._12_4_ = 0;
      }
    }
    ptr = pVar7.first;
    if ((byte *)ptr == (byte *)0x0) {
      cVar4 = '\x04';
    }
    else {
      tag = pVar7.second;
      uVar3 = (uint)(pVar7._8_8_ >> 3) & 0x1fffffff;
      if (uVar3 == 2) {
        if ((char)pVar7.second != '\x10') goto LAB_0034ca33;
        bVar1 = *ptr;
        pVar8.second = (long)(char)bVar1;
        pVar8.first = (char *)((byte *)ptr + 1);
        if ((long)(char)bVar1 < 0) {
          bVar2 = ((byte *)ptr)[1];
          uVar5 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
          if ((char)bVar2 < '\0') {
            pVar8 = internal::VarintParseSlow64(ptr,uVar5);
          }
          else {
            pVar8.second._0_4_ = uVar5;
            pVar8.first = (char *)((byte *)ptr + 2);
            pVar8.second._4_4_ = 0;
          }
        }
        ptr = pVar8.first;
        uVar6 = 2;
        this->is_extension_ = pVar8.second != 0;
        cVar4 = ((byte *)ptr == (byte *)0x0) * '\x02' + '\x02';
      }
      else {
        if ((uVar3 == 1) && ((char)pVar7.second == '\n')) {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          arena = (Arena *)(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           .ptr_;
          if (((ulong)arena & 1) != 0) {
            arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
          }
          if (this_00->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
            internal::ArenaStringPtr::CreateInstance
                      (this_00,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          }
          ptr = internal::InlineGreedyStringParser(this_00->ptr_,ptr,ctx);
        }
        else {
LAB_0034ca33:
          if (tag == 0 || (tag & 7) == 4) {
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
            cVar4 = '\a';
            goto LAB_0034ca9e;
          }
          ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr,ctx);
        }
        cVar4 = ((byte *)ptr == (byte *)0x0) * '\x02' + '\x02';
      }
    }
LAB_0034ca9e:
  } while (cVar4 == '\x02');
  if (cVar4 == '\x04') {
    ptr = (char *)0x0;
  }
LAB_0034caf1:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar6;
  return (char *)(byte *)ptr;
}

Assistant:

const char* UninterpretedOption_NamePart::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // required string name_part = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name_part(), ptr, ctx, "google.protobuf.UninterpretedOption.NamePart.name_part");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // required bool is_extension = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_is_extension(&has_bits);
          is_extension_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}